

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::Maximum(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                 uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  long lVar2;
  ulong uVar3;
  byte bVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  if (outY != outYEnd) {
    uVar3 = (ulong)totalSimdWidth;
    puVar5 = outY + uVar3;
    puVar6 = in2Y + uVar3;
    puVar7 = in1Y + uVar3;
    do {
      if (simdWidth != 0) {
        lVar2 = 0;
        do {
          auVar1 = vpmaxub_avx2(*(undefined1 (*) [32])(in1Y + lVar2),
                                *(undefined1 (*) [32])(in2Y + lVar2));
          *(undefined1 (*) [32])(outY + lVar2) = auVar1;
          lVar2 = lVar2 + 0x20;
        } while ((ulong)simdWidth << 5 != lVar2);
      }
      if (nonSimdWidth != 0) {
        uVar3 = 0;
        do {
          bVar4 = puVar7[uVar3];
          if (puVar7[uVar3] < puVar6[uVar3]) {
            bVar4 = puVar6[uVar3];
          }
          puVar5[uVar3] = bVar4;
          uVar3 = uVar3 + 1;
        } while (nonSimdWidth != uVar3);
      }
      outY = outY + rowSizeOut;
      in1Y = in1Y + rowSizeIn1;
      in2Y = in2Y + rowSizeIn2;
      puVar5 = puVar5 + rowSizeOut;
      puVar6 = puVar6 + rowSizeIn2;
      puVar7 = puVar7 + rowSizeIn1;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void Maximum( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                  uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm256_storeu_si256( dst, _mm256_max_epu8( _mm256_loadu_si256( src1 ), _mm256_loadu_si256( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X ) {
                    if( (*in2X) < (*in1X) )
                        (*outX) = (*in1X);
                    else
                        (*outX) = (*in2X);
                }
            }
        }
    }